

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O3

void __thiscall amrex::MLLinOp::AnyAvgDownResMG(MLLinOp *this,int clev,Any *cres,Any *fres)

{
  int ncomp;
  MultiFab *S_fine;
  MultiFab *S_crse;
  
  S_fine = Any::get<amrex::MultiFab>(fres);
  S_crse = Any::get<amrex::MultiFab>(cres);
  ncomp = (*this->_vptr_MLLinOp[5])(this);
  EB_average_down(S_fine,S_crse,0,ncomp,
                  (this->mg_coarsen_ratio_vec).
                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)clev + -1);
  return;
}

Assistant:

void
MLLinOp::AnyAvgDownResMG (int clev, Any& cres, Any const& fres) const
{
    AMREX_ASSERT(cres.is<MultiFab>());
#ifdef AMREX_USE_EB
    amrex::EB_average_down
#else
    amrex::average_down
#endif
        (fres.get<MultiFab>(), cres.get<MultiFab>(), 0, getNComp(),
         mg_coarsen_ratio_vec[clev-1]);
}